

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

optional<pbrt::TriangleIntersection> *
pbrt::IntersectTriangle(Ray *ray,Float tMax,Point3f p0,Point3f p1,Point3f p2)

{
  undefined8 uVar1;
  float fVar2;
  Point3<float> p;
  Point3<float> p_00;
  Point3<float> p_01;
  Point3<float> p_02;
  Vector3<float> v;
  Vector3<float> v_00;
  Vector3<float> v_01;
  Tuple3<pbrt::Vector3,_float> t_00;
  Tuple3<pbrt::Vector3,_float> t_01;
  Tuple3<pbrt::Vector3,_float> t_02;
  Tuple3<pbrt::Vector3,_float> t_03;
  Tuple3<pbrt::Vector3,_float> t_04;
  Vector3<float> w;
  Tuple3<pbrt::Vector3,_float> t_05;
  Tuple3<pbrt::Vector3,_float> t_06;
  Tuple3<pbrt::Vector3,_float> t_07;
  Tuple3<pbrt::Vector3,_float> t_08;
  array<int,_3> p_03;
  array<int,_3> p_04;
  array<int,_3> p_05;
  array<int,_3> p_06;
  initializer_list<int> v_02;
  initializer_list<int> v_03;
  initializer_list<int> v_04;
  initializer_list<int> v_05;
  Vector3<float> v_06;
  Tuple3<pbrt::Vector3,_float> t_09;
  Tuple3<pbrt::Point3,_float> t_10;
  Tuple3<pbrt::Point3,_float> t_11;
  Tuple3<pbrt::Point3,_float> t_12;
  Tuple3<pbrt::Vector3,_float> t_13;
  undefined8 *in_RSI;
  int __x;
  optional<pbrt::TriangleIntersection> *in_RDI;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar3;
  undefined1 auVar27 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  double dVar7;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  double dVar8;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 in_ZMM1 [64];
  undefined4 in_XMM2_Da;
  undefined1 in_ZMM3 [64];
  undefined1 in_XMM5 [16];
  Vector3<float> VVar28;
  Point3<float> PVar29;
  Float deltaT;
  Float maxE;
  Float deltaE;
  Float deltaY;
  Float deltaX;
  Float maxYt;
  Float maxXt;
  Float deltaZ;
  Float maxZt;
  Float t;
  Float b2;
  Float b1;
  Float b0;
  Float invDet;
  Float tScaled;
  Float det;
  double p1typ0tx;
  double p1txp0ty;
  double p0typ2tx;
  double p0txp2ty;
  double p2typ1tx;
  double p2txp1ty;
  Float e2;
  Float e1;
  Float e0;
  Float Sz;
  Float Sy;
  Float Sx;
  Vector3f d;
  int ky;
  int kx;
  int kz;
  Point3f p2t;
  Point3f p1t;
  Point3f p0t;
  float in_stack_fffffffffffff8e8;
  float y;
  float in_stack_fffffffffffff8ec;
  float d_00;
  float c;
  float in_stack_fffffffffffff900;
  float in_stack_fffffffffffff904;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  float in_stack_fffffffffffff918;
  float in_stack_fffffffffffff91c;
  undefined4 in_stack_fffffffffffff920;
  float in_stack_fffffffffffff924;
  int in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff92c;
  undefined4 in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff934;
  float in_stack_fffffffffffff938;
  float in_stack_fffffffffffff940;
  undefined8 in_stack_fffffffffffff944;
  float local_4c0;
  float local_4bc;
  float local_4b8;
  int local_474;
  int local_470;
  int local_46c;
  int *local_468;
  undefined8 local_460;
  undefined8 local_448;
  float local_440;
  undefined8 local_43c;
  float local_434;
  undefined8 local_430;
  float local_428;
  undefined8 local_420;
  undefined4 local_418;
  undefined8 local_410;
  float local_408;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int *local_3f0;
  undefined8 local_3e8;
  undefined8 local_3dc;
  undefined4 local_3d4;
  undefined8 local_3d0;
  float local_3c8;
  undefined8 local_3c0;
  float local_3b8;
  undefined8 local_3b0;
  float local_3a8;
  undefined8 local_3a0;
  undefined4 local_398;
  undefined8 local_390;
  float local_388;
  int local_37c;
  int local_378;
  int local_374;
  int *local_370;
  undefined8 local_368;
  undefined8 local_35c;
  undefined4 local_354;
  undefined8 local_350;
  float local_348;
  undefined8 local_340;
  float local_338;
  undefined8 local_330;
  float local_328;
  undefined8 local_320;
  undefined4 local_318;
  undefined8 local_310;
  undefined4 local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int *local_2f0;
  undefined8 local_2e8;
  undefined8 local_2dc;
  undefined4 local_2d4;
  undefined8 local_2d0;
  undefined4 local_2c8;
  undefined8 local_2c0;
  float local_2b8;
  int local_2b0;
  int local_2ac;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  undefined8 local_288;
  undefined4 local_280;
  undefined8 local_278;
  undefined4 local_270;
  undefined8 local_268;
  float local_260;
  undefined8 local_258;
  float local_250;
  int local_24c;
  undefined8 local_248;
  float local_240;
  undefined8 local_238;
  undefined4 local_230;
  undefined8 local_228;
  undefined4 local_220;
  undefined8 local_218;
  undefined4 local_210;
  undefined8 local_20c;
  undefined4 local_204;
  undefined8 local_200;
  float local_1f8;
  undefined8 local_1f0;
  float local_1e8;
  undefined8 local_1e0;
  undefined4 local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined8 local_1b4;
  undefined4 local_1ac;
  undefined8 local_1a8;
  float local_1a0;
  undefined8 local_198;
  float local_190;
  undefined8 local_188;
  undefined4 local_180;
  undefined8 local_178;
  undefined4 local_170;
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_15c;
  undefined4 local_154;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  undefined8 local_a0;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  float local_74;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  undefined4 local_10;
  undefined1 auVar9 [64];
  undefined1 auVar12 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  d_00 = SUB84(in_RDI,0);
  c = (float)((ulong)in_RDI >> 0x20);
  local_b0 = vmovlpd_avx(in_ZMM1._0_16_);
  local_48 = vmovlpd_avx(in_ZMM3._0_16_);
  local_68 = vmovlpd_avx(in_XMM5);
  auVar27 = ZEXT856(0);
  PVar29.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff914;
  PVar29.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff910;
  PVar29.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff918;
  local_a0 = local_b0;
  local_74 = in_XMM0_Da;
  local_70 = in_RSI;
  local_58 = local_68;
  local_38 = local_48;
  local_28 = local_b0;
  local_18 = local_b0;
  local_10 = in_XMM2_Da;
  VVar28 = Point3<float>::operator-((Point3<float> *)in_RDI,PVar29);
  local_b8 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar27;
  local_c0 = vmovlpd_avx(auVar9._0_16_);
  local_d8 = local_10;
  local_e0 = local_18;
  local_e8 = local_10;
  local_f0 = local_18;
  auVar27 = ZEXT856(0);
  p_02.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff914;
  p_02.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff910;
  p_02.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff918;
  local_90 = local_c0;
  local_88 = local_b8;
  VVar28 = Point3<float>::operator-((Point3<float> *)CONCAT44(c,d_00),p_02);
  local_118 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar27;
  local_120 = vmovlpd_avx(auVar10._0_16_);
  local_108 = local_88;
  local_110 = local_90;
  auVar27 = ZEXT856(0);
  v_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff934;
  v_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff930;
  v_06.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff938;
  w.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff918;
  w.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff914;
  w.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff91c;
  local_100 = local_120;
  local_f8 = local_118;
  local_d0 = local_120;
  local_c8 = local_118;
  VVar28 = Cross<float>(v_06,w);
  local_138 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar27;
  local_140 = vmovlpd_avx(auVar11._0_16_);
  VVar28.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff900;
  VVar28.super_Tuple3<pbrt::Vector3,_float>.x = c;
  VVar28.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff904;
  local_130 = local_140;
  local_128 = local_138;
  local_80 = local_140;
  local_78 = local_138;
  fVar3 = LengthSquared<float>(VVar28);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    local_170 = *(undefined4 *)(local_70 + 1);
    local_178 = *local_70;
    p.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff900;
    p.super_Tuple3<pbrt::Point3,_float>.x = c;
    p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff904;
    local_168 = local_178;
    local_160 = local_170;
    Vector3<float>::Vector3<float>((Vector3<float> *)0x56f493,p);
    local_180 = local_154;
    local_188 = local_15c;
    auVar27 = ZEXT856(0);
    v.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff914;
    v.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff910;
    v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff918;
    PVar29 = Point3<float>::operator-((Point3<float> *)CONCAT44(c,d_00),v);
    local_190 = PVar29.super_Tuple3<pbrt::Point3,_float>.z;
    auVar12._0_8_ = PVar29.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar27;
    local_198 = vmovlpd_avx(auVar12._0_16_);
    local_1c8 = *(undefined4 *)(local_70 + 1);
    local_1d0 = *local_70;
    p_00.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff900;
    p_00.super_Tuple3<pbrt::Point3,_float>.x = c;
    p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff904;
    local_1c0 = local_1d0;
    local_1b8 = local_1c8;
    local_150 = local_198;
    local_148 = local_190;
    Vector3<float>::Vector3<float>((Vector3<float> *)0x56f55a,p_00);
    local_1d8 = local_1ac;
    local_1e0 = local_1b4;
    auVar27 = ZEXT856(0);
    v_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff914;
    v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff910;
    v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff918;
    PVar29 = Point3<float>::operator-((Point3<float> *)CONCAT44(c,d_00),v_00);
    local_1e8 = PVar29.super_Tuple3<pbrt::Point3,_float>.z;
    auVar13._0_8_ = PVar29.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar13._8_56_ = auVar27;
    local_1f0 = vmovlpd_avx(auVar13._0_16_);
    local_220 = *(undefined4 *)(local_70 + 1);
    local_228 = *local_70;
    p_01.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff900;
    p_01.super_Tuple3<pbrt::Point3,_float>.x = c;
    p_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff904;
    local_218 = local_228;
    local_210 = local_220;
    local_1a8 = local_1f0;
    local_1a0 = local_1e8;
    Vector3<float>::Vector3<float>((Vector3<float> *)0x56f621,p_01);
    local_230 = local_204;
    local_238 = local_20c;
    auVar27 = ZEXT856(0);
    v_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff914;
    v_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff910;
    v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff918;
    PVar29 = Point3<float>::operator-((Point3<float> *)CONCAT44(c,d_00),v_01);
    local_240 = PVar29.super_Tuple3<pbrt::Point3,_float>.z;
    auVar14._0_8_ = PVar29.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar14._8_56_ = auVar27;
    local_248 = vmovlpd_avx(auVar14._0_16_);
    local_280 = *(undefined4 *)((long)local_70 + 0x14);
    local_288 = *(undefined8 *)((long)local_70 + 0xc);
    auVar27 = ZEXT856(0);
    t_00.y = (float)in_stack_fffffffffffff914;
    t_00.x = (float)in_stack_fffffffffffff910;
    t_00.z = in_stack_fffffffffffff918;
    local_278 = local_288;
    local_270 = local_280;
    local_200 = local_248;
    local_1f8 = local_240;
    VVar28 = Abs<pbrt::Vector3,float>(t_00);
    local_2a0 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar15._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar15._8_56_ = auVar27;
    local_2a8 = vmovlpd_avx(auVar15._0_16_);
    t_13.z = local_2a0;
    t_13.x = (float)(int)local_2a8;
    t_13.y = (float)(int)((ulong)local_2a8 >> 0x20);
    local_298 = local_2a8;
    local_290 = local_2a0;
    local_268 = local_2a8;
    local_260 = local_2a0;
    local_258 = local_2a8;
    local_250 = local_2a0;
    local_2f4 = MaxComponentIndex<pbrt::Vector3,float>(t_13);
    local_2ac = local_2f4 + 1;
    if (local_2ac == 3) {
      local_2ac = 0;
    }
    local_2b0 = local_2ac + 1;
    if (local_2b0 == 3) {
      local_2b0 = 0;
    }
    local_2c8 = *(undefined4 *)((long)local_70 + 0x14);
    local_2d0 = *(undefined8 *)((long)local_70 + 0xc);
    local_2fc = local_2ac;
    local_2f8 = local_2b0;
    local_2f0 = &local_2fc;
    local_2e8 = 3;
    v_02._M_array._4_4_ = in_stack_fffffffffffff92c;
    v_02._M_array._0_4_ = in_stack_fffffffffffff928;
    v_02._M_len._0_4_ = in_stack_fffffffffffff930;
    v_02._M_len._4_4_ = in_stack_fffffffffffff934;
    local_24c = local_2f4;
    pstd::array<int,_3>::array
              ((array<int,_3> *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),v_02);
    local_308 = local_2c8;
    local_310 = local_2d0;
    auVar27 = ZEXT856(0);
    local_318 = local_2d4;
    local_320 = local_2dc;
    t_09.y = (float)(int)in_stack_fffffffffffff944;
    t_09.z = (float)(int)((ulong)in_stack_fffffffffffff944 >> 0x20);
    t_09.x = in_stack_fffffffffffff940;
    p_03.values[1] = (int)in_stack_fffffffffffff924;
    p_03.values[0] = in_stack_fffffffffffff920;
    p_03.values[2] = in_stack_fffffffffffff928;
    VVar28 = Permute<pbrt::Vector3,float>(t_09,p_03);
    local_328 = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar16._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar16._8_56_ = auVar27;
    local_330 = vmovlpd_avx(auVar16._0_16_);
    local_348 = local_148;
    local_350 = local_150;
    local_37c = local_2ac;
    local_378 = local_2b0;
    local_374 = local_24c;
    local_370 = &local_37c;
    local_368 = 3;
    v_03._M_array._4_4_ = in_stack_fffffffffffff92c;
    v_03._M_array._0_4_ = in_stack_fffffffffffff928;
    v_03._M_len._0_4_ = in_stack_fffffffffffff930;
    v_03._M_len._4_4_ = in_stack_fffffffffffff934;
    local_2c0 = local_330;
    local_2b8 = local_328;
    pstd::array<int,_3>::array
              ((array<int,_3> *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),v_03);
    local_388 = local_348;
    local_390 = local_350;
    auVar27 = ZEXT856(0);
    local_398 = local_354;
    local_3a0 = local_35c;
    t_10.y = (float)(int)in_stack_fffffffffffff944;
    t_10.z = (float)(int)((ulong)in_stack_fffffffffffff944 >> 0x20);
    t_10.x = in_stack_fffffffffffff940;
    p_04.values[1] = (int)in_stack_fffffffffffff924;
    p_04.values[0] = in_stack_fffffffffffff920;
    p_04.values[2] = in_stack_fffffffffffff928;
    PVar29 = Permute<pbrt::Point3,float>(t_10,p_04);
    local_3a8 = PVar29.super_Tuple3<pbrt::Point3,_float>.z;
    auVar17._0_8_ = PVar29.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar17._8_56_ = auVar27;
    local_3b0 = vmovlpd_avx(auVar17._0_16_);
    local_3c8 = local_1a0;
    local_3d0 = local_1a8;
    local_3fc = local_2ac;
    local_3f8 = local_2b0;
    local_3f4 = local_24c;
    local_3f0 = &local_3fc;
    local_3e8 = 3;
    v_04._M_array._4_4_ = in_stack_fffffffffffff92c;
    v_04._M_array._0_4_ = in_stack_fffffffffffff928;
    v_04._M_len._0_4_ = in_stack_fffffffffffff930;
    v_04._M_len._4_4_ = in_stack_fffffffffffff934;
    local_340 = local_3b0;
    local_338 = local_3a8;
    local_150 = local_3b0;
    local_148 = local_3a8;
    pstd::array<int,_3>::array
              ((array<int,_3> *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),v_04);
    local_408 = local_3c8;
    local_410 = local_3d0;
    auVar27 = ZEXT856(0);
    local_418 = local_3d4;
    local_420 = local_3dc;
    t_11.y = (float)(int)in_stack_fffffffffffff944;
    t_11.z = (float)(int)((ulong)in_stack_fffffffffffff944 >> 0x20);
    t_11.x = in_stack_fffffffffffff940;
    p_05.values[1] = (int)in_stack_fffffffffffff924;
    p_05.values[0] = in_stack_fffffffffffff920;
    p_05.values[2] = in_stack_fffffffffffff928;
    PVar29 = Permute<pbrt::Point3,float>(t_11,p_05);
    local_428 = PVar29.super_Tuple3<pbrt::Point3,_float>.z;
    auVar18._0_8_ = PVar29.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar18._8_56_ = auVar27;
    local_430 = vmovlpd_avx(auVar18._0_16_);
    local_440 = local_1f8;
    local_448 = local_200;
    local_474 = local_2ac;
    local_470 = local_2b0;
    local_46c = local_24c;
    local_468 = &local_474;
    local_460 = 3;
    v_05._M_array._4_4_ = in_stack_fffffffffffff92c;
    v_05._M_array._0_4_ = in_stack_fffffffffffff928;
    v_05._M_len._0_4_ = in_stack_fffffffffffff930;
    v_05._M_len._4_4_ = in_stack_fffffffffffff934;
    local_3c0 = local_430;
    local_3b8 = local_428;
    local_1a8 = local_430;
    local_1a0 = local_428;
    pstd::array<int,_3>::array
              ((array<int,_3> *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),v_05);
    auVar27 = ZEXT856(0);
    t_12.y = (float)(int)in_stack_fffffffffffff944;
    t_12.z = (float)(int)((ulong)in_stack_fffffffffffff944 >> 0x20);
    t_12.x = in_stack_fffffffffffff940;
    p_06.values[1] = (int)in_stack_fffffffffffff924;
    p_06.values[0] = in_stack_fffffffffffff920;
    p_06.values[2] = in_stack_fffffffffffff928;
    PVar29 = Permute<pbrt::Point3,float>(t_12,p_06);
    local_434 = PVar29.super_Tuple3<pbrt::Point3,_float>.z;
    auVar19._0_8_ = PVar29.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar19._8_56_ = auVar27;
    local_43c = vmovlpd_avx(auVar19._0_16_);
    fVar3 = -(float)local_2c0 / local_2b8;
    fVar4 = -local_2c0._4_4_ / local_2b8;
    fVar5 = 1.0 / local_2b8;
    local_150._4_4_ = fVar4 * local_148 + local_150._4_4_;
    local_1a8._4_4_ = fVar4 * local_1a0 + local_1a8._4_4_;
    local_200._0_4_ = (float)local_43c;
    local_200._0_4_ = fVar3 * local_434 + (float)local_200;
    local_200._4_4_ = (float)((ulong)local_43c >> 0x20);
    local_200._4_4_ = fVar4 * local_434 + local_200._4_4_;
    local_1f8 = local_434;
    local_1a8._0_4_ = fVar3 * local_1a0 + (float)local_1a8;
    local_150._0_4_ = fVar3 * local_148 + (float)local_150;
    local_4b8 = DifferenceOfProducts<float,float,float,float>
                          (in_stack_fffffffffffff904,in_stack_fffffffffffff900,c,d_00);
    local_4bc = DifferenceOfProducts<float,float,float,float>
                          (in_stack_fffffffffffff904,in_stack_fffffffffffff900,c,d_00);
    local_4c0 = DifferenceOfProducts<float,float,float,float>
                          (in_stack_fffffffffffff904,in_stack_fffffffffffff900,c,d_00);
    if ((((local_4b8 == 0.0) && (!NAN(local_4b8))) || ((local_4bc == 0.0 && (!NAN(local_4bc))))) ||
       ((local_4c0 == 0.0 && (!NAN(local_4c0))))) {
      local_4b8 = local_200._4_4_ * (float)local_1a8 - (float)local_200 * local_1a8._4_4_;
      local_4bc = local_150._4_4_ * (float)local_200 - (float)local_150 * local_200._4_4_;
      local_4c0 = local_1a8._4_4_ * (float)local_150 - (float)local_1a8 * local_150._4_4_;
    }
    if ((((0.0 <= local_4b8) && (0.0 <= local_4bc)) && (0.0 <= local_4c0)) ||
       (((local_4b8 <= 0.0 && (local_4bc <= 0.0)) && (local_4c0 <= 0.0)))) {
      fVar3 = local_4b8 + local_4bc + local_4c0;
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        local_148 = fVar5 * local_148;
        local_1a0 = fVar5 * local_1a0;
        local_1f8 = fVar5 * local_1f8;
        fVar4 = local_4b8 * local_148 + local_4bc * local_1a0 + local_4c0 * local_1f8;
        if ((0.0 <= fVar3) || ((fVar4 < 0.0 && (local_74 * fVar3 <= fVar4)))) {
          if ((fVar3 <= 0.0) || ((0.0 < fVar4 && (fVar4 <= local_74 * fVar3)))) {
            fVar3 = 1.0 / fVar3;
            fVar4 = fVar4 * fVar3;
            Vector3<float>::Vector3
                      ((Vector3<float> *)in_RDI,in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8,
                       0.0);
            auVar27 = ZEXT856(0);
            t_01.y = (float)in_stack_fffffffffffff914;
            t_01.x = (float)in_stack_fffffffffffff910;
            t_01.z = in_stack_fffffffffffff918;
            VVar28 = Abs<pbrt::Vector3,float>(t_01);
            auVar20._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar20._8_56_ = auVar27;
            vmovlpd_avx(auVar20._0_16_);
            t_05.y = (float)in_stack_fffffffffffff920;
            t_05.x = in_stack_fffffffffffff91c;
            t_05.z = in_stack_fffffffffffff924;
            auVar21._0_4_ = MaxComponentValue<pbrt::Vector3,float>(t_05);
            auVar21._4_60_ = extraout_var;
            dVar7 = gamma(auVar21._0_8_);
            Vector3<float>::Vector3
                      ((Vector3<float> *)in_RDI,in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8,
                       0.0);
            auVar27 = ZEXT856(0);
            t_02.y = (float)in_stack_fffffffffffff914;
            t_02.x = (float)in_stack_fffffffffffff910;
            t_02.z = in_stack_fffffffffffff918;
            VVar28 = Abs<pbrt::Vector3,float>(t_02);
            auVar22._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar22._8_56_ = auVar27;
            vmovlpd_avx(auVar22._0_16_);
            t_06.y = (float)in_stack_fffffffffffff920;
            t_06.x = in_stack_fffffffffffff91c;
            t_06.z = in_stack_fffffffffffff924;
            fVar6 = MaxComponentValue<pbrt::Vector3,float>(t_06);
            Vector3<float>::Vector3
                      ((Vector3<float> *)in_RDI,in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8,
                       0.0);
            auVar27 = ZEXT856(0);
            t_03.y = (float)in_stack_fffffffffffff914;
            t_03.x = (float)in_stack_fffffffffffff910;
            t_03.z = in_stack_fffffffffffff918;
            VVar28 = Abs<pbrt::Vector3,float>(t_03);
            auVar23._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar23._8_56_ = auVar27;
            vmovlpd_avx(auVar23._0_16_);
            t_07.y = (float)in_stack_fffffffffffff920;
            t_07.x = in_stack_fffffffffffff91c;
            t_07.z = in_stack_fffffffffffff924;
            auVar24._0_4_ = MaxComponentValue<pbrt::Vector3,float>(t_07);
            auVar24._4_60_ = extraout_var_00;
            y = 7.00649e-45;
            dVar8 = gamma(auVar24._0_8_);
            fVar5 = SUB84(dVar8,0) * (fVar6 + auVar21._0_4_);
            dVar8 = gamma((double)(ulong)(uint)fVar5);
            fVar2 = SUB84(dVar8,0) * (auVar24._0_4_ + auVar21._0_4_);
            dVar8 = gamma((double)(ulong)(uint)fVar2);
            fVar5 = SUB84(dVar8,0) * fVar6 * auVar24._0_4_ + fVar2 * fVar6 + fVar5 * auVar24._0_4_;
            Vector3<float>::Vector3((Vector3<float> *)in_RDI,in_stack_fffffffffffff8ec,y,0.0);
            auVar27 = ZEXT856(0);
            t_04.y = (float)in_stack_fffffffffffff914;
            t_04.x = (float)in_stack_fffffffffffff910;
            t_04.z = in_stack_fffffffffffff918;
            VVar28 = Abs<pbrt::Vector3,float>(t_04);
            auVar25._0_8_ = VVar28.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            auVar25._8_56_ = auVar27;
            uVar1 = vmovlpd_avx(auVar25._0_16_);
            t_08.y = VVar28.super_Tuple3<pbrt::Vector3,_float>.z;
            t_08.x = (float)(int)((ulong)uVar1 >> 0x20);
            t_08.z = in_stack_fffffffffffff924;
            auVar26._0_4_ = MaxComponentValue<pbrt::Vector3,float>(t_08);
            auVar26._4_60_ = extraout_var_01;
            __x = 3;
            dVar8 = gamma(auVar26._0_8_);
            fVar5 = (SUB84(dVar8,0) * auVar26._0_4_ * auVar21._0_4_ +
                     (fVar5 + fVar5) * auVar21._0_4_ +
                    SUB84(dVar7,0) * auVar21._0_4_ * auVar26._0_4_) * 3.0;
            std::abs(__x);
            if (fVar5 * fVar3 < fVar4) {
              pstd::optional<pbrt::TriangleIntersection>::optional
                        (in_RDI,(TriangleIntersection *)CONCAT44(fVar5,y));
            }
            else {
              memset(in_RDI,0,0x14);
              pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
            }
          }
          else {
            memset(in_RDI,0,0x14);
            pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
          }
        }
        else {
          memset(in_RDI,0,0x14);
          pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
        }
      }
      else {
        memset(in_RDI,0,0x14);
        pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
      }
    }
    else {
      memset(in_RDI,0,0x14);
      pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
    }
  }
  else {
    memset(in_RDI,0,0x14);
    pstd::optional<pbrt::TriangleIntersection>::optional(in_RDI);
  }
  return (optional<pbrt::TriangleIntersection> *)CONCAT44(c,d_00);
}

Assistant:

PBRT_CPU_GPU pstd::optional<TriangleIntersection> IntersectTriangle(const Ray &ray, Float tMax,
                                                       Point3f p0, Point3f p1,
                                                       Point3f p2) {
    // Return no intersection if triangle is degenerate
    if (LengthSquared(Cross(p2 - p0, p1 - p0)) == 0)
        return {};

    // Transform triangle vertices to ray coordinate space
    // Translate vertices based on ray origin
    Point3f p0t = p0 - Vector3f(ray.o);
    Point3f p1t = p1 - Vector3f(ray.o);
    Point3f p2t = p2 - Vector3f(ray.o);

    // Permute components of triangle vertices and ray direction
    int kz = MaxComponentIndex(Abs(ray.d));
    int kx = kz + 1;
    if (kx == 3)
        kx = 0;
    int ky = kx + 1;
    if (ky == 3)
        ky = 0;
    Vector3f d = Permute(ray.d, {kx, ky, kz});
    p0t = Permute(p0t, {kx, ky, kz});
    p1t = Permute(p1t, {kx, ky, kz});
    p2t = Permute(p2t, {kx, ky, kz});

    // Apply shear transformation to translated vertex positions
    Float Sx = -d.x / d.z;
    Float Sy = -d.y / d.z;
    Float Sz = 1 / d.z;
    p0t.x += Sx * p0t.z;
    p0t.y += Sy * p0t.z;
    p1t.x += Sx * p1t.z;
    p1t.y += Sy * p1t.z;
    p2t.x += Sx * p2t.z;
    p2t.y += Sy * p2t.z;

    // Compute edge function coefficients _e0_, _e1_, and _e2_
    Float e0 = DifferenceOfProducts(p1t.x, p2t.y, p1t.y, p2t.x);
    Float e1 = DifferenceOfProducts(p2t.x, p0t.y, p2t.y, p0t.x);
    Float e2 = DifferenceOfProducts(p0t.x, p1t.y, p0t.y, p1t.x);

    // Fall back to double-precision test at triangle edges
    if (sizeof(Float) == sizeof(float) && (e0 == 0.0f || e1 == 0.0f || e2 == 0.0f)) {
        double p2txp1ty = (double)p2t.x * (double)p1t.y;
        double p2typ1tx = (double)p2t.y * (double)p1t.x;
        e0 = (float)(p2typ1tx - p2txp1ty);
        double p0txp2ty = (double)p0t.x * (double)p2t.y;
        double p0typ2tx = (double)p0t.y * (double)p2t.x;
        e1 = (float)(p0typ2tx - p0txp2ty);
        double p1txp0ty = (double)p1t.x * (double)p0t.y;
        double p1typ0tx = (double)p1t.y * (double)p0t.x;
        e2 = (float)(p1typ0tx - p1txp0ty);
    }

    // Perform triangle edge and determinant tests
    if ((e0 < 0 || e1 < 0 || e2 < 0) && (e0 > 0 || e1 > 0 || e2 > 0))
        return {};
    Float det = e0 + e1 + e2;
    if (det == 0)
        return {};

    // Compute scaled hit distance to triangle and test against ray $t$ range
    p0t.z *= Sz;
    p1t.z *= Sz;
    p2t.z *= Sz;
    Float tScaled = e0 * p0t.z + e1 * p1t.z + e2 * p2t.z;
    if (det < 0 && (tScaled >= 0 || tScaled < tMax * det))
        return {};
    else if (det > 0 && (tScaled <= 0 || tScaled > tMax * det))
        return {};

    // Compute barycentric coordinates and $t$ value for triangle intersection
    Float invDet = 1 / det;
    Float b0 = e0 * invDet, b1 = e1 * invDet, b2 = e2 * invDet;
    Float t = tScaled * invDet;
    DCHECK(!IsNaN(t));

    // Ensure that computed triangle $t$ is conservatively greater than zero
    // Compute $\delta_z$ term for triangle $t$ error bounds
    Float maxZt = MaxComponentValue(Abs(Vector3f(p0t.z, p1t.z, p2t.z)));
    Float deltaZ = gamma(3) * maxZt;

    // Compute $\delta_x$ and $\delta_y$ terms for triangle $t$ error bounds
    Float maxXt = MaxComponentValue(Abs(Vector3f(p0t.x, p1t.x, p2t.x)));
    Float maxYt = MaxComponentValue(Abs(Vector3f(p0t.y, p1t.y, p2t.y)));
    Float deltaX = gamma(5) * (maxXt + maxZt);
    Float deltaY = gamma(5) * (maxYt + maxZt);

    // Compute $\delta_e$ term for triangle $t$ error bounds
    Float deltaE = 2 * (gamma(2) * maxXt * maxYt + deltaY * maxXt + deltaX * maxYt);

    // Compute $\delta_t$ term for triangle $t$ error bounds and check _t_
    Float maxE = MaxComponentValue(Abs(Vector3f(e0, e1, e2)));
    Float deltaT =
        3 * (gamma(3) * maxE * maxZt + deltaE * maxZt + deltaZ * maxE) * std::abs(invDet);
    if (t <= deltaT)
        return {};

    // Return _TriangleIntersection_ for intersection
    return TriangleIntersection{b0, b1, b2, t};
}